

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::Impl::copy_render_pass
          (Impl *this,VkRenderPassCreateInfo *create_info,ScratchAllocator *alloc,
          VkRenderPassCreateInfo **out_create_info)

{
  bool bVar1;
  VkRenderPassCreateInfo *pVVar2;
  VkAttachmentDescription *pVVar3;
  VkSubpassDescription *pVVar4;
  VkSubpassDependency *pVVar5;
  VkAttachmentReference *pVVar6;
  uint *puVar7;
  VkSubpassDescription *sub;
  uint32_t i;
  VkRenderPassCreateInfo *info;
  VkRenderPassCreateInfo **out_create_info_local;
  ScratchAllocator *alloc_local;
  VkRenderPassCreateInfo *create_info_local;
  Impl *this_local;
  
  pVVar2 = copy<VkRenderPassCreateInfo>(this,create_info,1,alloc);
  pVVar3 = copy<VkAttachmentDescription>
                     (this,pVVar2->pAttachments,(ulong)pVVar2->attachmentCount,alloc);
  pVVar2->pAttachments = pVVar3;
  pVVar4 = copy<VkSubpassDescription>(this,pVVar2->pSubpasses,(ulong)pVVar2->subpassCount,alloc);
  pVVar2->pSubpasses = pVVar4;
  pVVar5 = copy<VkSubpassDependency>
                     (this,pVVar2->pDependencies,(ulong)pVVar2->dependencyCount,alloc);
  pVVar2->pDependencies = pVVar5;
  for (sub._4_4_ = 0; sub._4_4_ < pVVar2->subpassCount; sub._4_4_ = sub._4_4_ + 1) {
    pVVar4 = pVVar2->pSubpasses;
    if (pVVar4[sub._4_4_].pDepthStencilAttachment != (VkAttachmentReference *)0x0) {
      pVVar6 = copy<VkAttachmentReference>(this,pVVar4[sub._4_4_].pDepthStencilAttachment,1,alloc);
      pVVar4[sub._4_4_].pDepthStencilAttachment = pVVar6;
    }
    if (pVVar4[sub._4_4_].pColorAttachments != (VkAttachmentReference *)0x0) {
      pVVar6 = copy<VkAttachmentReference>
                         (this,pVVar4[sub._4_4_].pColorAttachments,
                          (ulong)pVVar4[sub._4_4_].colorAttachmentCount,alloc);
      pVVar4[sub._4_4_].pColorAttachments = pVVar6;
    }
    if (pVVar4[sub._4_4_].pResolveAttachments != (VkAttachmentReference *)0x0) {
      pVVar6 = copy<VkAttachmentReference>
                         (this,pVVar4[sub._4_4_].pResolveAttachments,
                          (ulong)pVVar4[sub._4_4_].colorAttachmentCount,alloc);
      pVVar4[sub._4_4_].pResolveAttachments = pVVar6;
    }
    if (pVVar4[sub._4_4_].pInputAttachments != (VkAttachmentReference *)0x0) {
      pVVar6 = copy<VkAttachmentReference>
                         (this,pVVar4[sub._4_4_].pInputAttachments,
                          (ulong)pVVar4[sub._4_4_].inputAttachmentCount,alloc);
      pVVar4[sub._4_4_].pInputAttachments = pVVar6;
    }
    if (pVVar4[sub._4_4_].pPreserveAttachments != (uint32_t *)0x0) {
      puVar7 = copy<unsigned_int>(this,pVVar4[sub._4_4_].pPreserveAttachments,
                                  (ulong)pVVar4[sub._4_4_].preserveAttachmentCount,alloc);
      pVVar4[sub._4_4_].pPreserveAttachments = puVar7;
    }
  }
  bVar1 = copy_pnext_chain(this,create_info->pNext,alloc,&pVVar2->pNext,(DynamicStateInfo *)0x0,0);
  if (bVar1) {
    *out_create_info = pVVar2;
  }
  return bVar1;
}

Assistant:

bool StateRecorder::Impl::copy_render_pass(const VkRenderPassCreateInfo *create_info, ScratchAllocator &alloc,
                                           VkRenderPassCreateInfo **out_create_info)
{
	auto *info = copy(create_info, 1, alloc);
	info->pAttachments = copy(info->pAttachments, info->attachmentCount, alloc);
	info->pSubpasses = copy(info->pSubpasses, info->subpassCount, alloc);
	info->pDependencies = copy(info->pDependencies, info->dependencyCount, alloc);

	for (uint32_t i = 0; i < info->subpassCount; i++)
	{
		auto &sub = const_cast<VkSubpassDescription &>(info->pSubpasses[i]);
		if (sub.pDepthStencilAttachment)
			sub.pDepthStencilAttachment = copy(sub.pDepthStencilAttachment, 1, alloc);
		if (sub.pColorAttachments)
			sub.pColorAttachments = copy(sub.pColorAttachments, sub.colorAttachmentCount, alloc);
		if (sub.pResolveAttachments)
			sub.pResolveAttachments = copy(sub.pResolveAttachments, sub.colorAttachmentCount, alloc);
		if (sub.pInputAttachments)
			sub.pInputAttachments = copy(sub.pInputAttachments, sub.inputAttachmentCount, alloc);
		if (sub.pPreserveAttachments)
			sub.pPreserveAttachments = copy(sub.pPreserveAttachments, sub.preserveAttachmentCount, alloc);
	}

	if (!copy_pnext_chain(create_info->pNext, alloc, &info->pNext, nullptr, 0))
		return false;

	*out_create_info = info;
	return true;
}